

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayCommI.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::FArrayBox>::copyTo
          (FabArray<amrex::FArrayBox> *this,FArrayBox *dest,int scomp,int dcomp,int ncomp,int nghost
          )

{
  initializer_list<int> iVar1;
  int iVar2;
  MFInfo *factory;
  FabArray<amrex::FArrayBox> *pFVar3;
  BaseFab<double> *in_RSI;
  FabArrayBase *in_RDI;
  FabArray<amrex::FArrayBox> destmf;
  DistributionMapping dm;
  BoxArray ba;
  int root_proc;
  allocator_type *in_stack_fffffffffffffcb8;
  BoxArray *bxs;
  int ncomp_00;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  FArrayBox *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  undefined1 *puVar4;
  int boxno;
  FabArray<amrex::FArrayBox> *this_00;
  Box *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  FabArray<amrex::FArrayBox> *src;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd40;
  Periodicity *in_stack_fffffffffffffd48;
  CpOp in_stack_fffffffffffffd50;
  undefined1 local_290 [451];
  undefined1 local_cd [169];
  int local_24;
  BaseFab<double> *local_10;
  
  local_10 = in_RSI;
  FabArrayBase::DistributionMap(in_RDI);
  local_24 = DistributionMapping::operator[]
                       ((DistributionMapping *)in_stack_fffffffffffffcc0,
                        (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20));
  BaseFab<double>::box(local_10);
  BoxArray::BoxArray((BoxArray *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                     in_stack_fffffffffffffd00);
  local_cd._1_4_ = local_24;
  local_cd._5_8_ = local_cd + 1;
  local_cd._13_8_ = 1;
  src = (FabArray<amrex::FArrayBox> *)local_cd;
  std::allocator<int>::allocator((allocator<int> *)0x5a2421);
  iVar1._M_array._4_4_ = in_stack_fffffffffffffccc;
  iVar1._M_array._0_4_ = in_stack_fffffffffffffcc8;
  iVar1._M_len = (size_type)in_stack_fffffffffffffcd0;
  Vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffcc0,iVar1,in_stack_fffffffffffffcb8);
  pFVar3 = (FabArray<amrex::FArrayBox> *)(local_cd + 0x2d);
  puVar4 = local_cd + 0x15;
  DistributionMapping::DistributionMapping
            ((DistributionMapping *)in_stack_fffffffffffffcc0,
             (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb8);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x5a246e);
  std::allocator<int>::~allocator((allocator<int> *)0x5a247b);
  local_290._24_8_ = 0;
  local_290._32_8_ = 0;
  local_290._8_8_ = 0;
  local_290._16_8_ = 0;
  local_290._40_8_ = 0;
  this_00 = (FabArray<amrex::FArrayBox> *)(local_290 + 8);
  MFInfo::MFInfo((MFInfo *)0x5a24b7);
  factory = MFInfo::SetAlloc((MFInfo *)this_00,false);
  local_290._0_8_ = 0;
  bxs = (BoxArray *)local_290;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffcc0);
  FabArray(pFVar3,bxs,(DistributionMapping *)this_00,(int)((ulong)puVar4 >> 0x20),(int)puVar4,
           (MFInfo *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
           (FabFactory<amrex::FArrayBox> *)factory);
  boxno = (int)((ulong)puVar4 >> 0x20);
  ncomp_00 = (int)((ulong)bxs >> 0x20);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x5a252c);
  MFInfo::~MFInfo((MFInfo *)0x5a2539);
  iVar2 = ParallelDescriptor::MyProc();
  if (iVar2 == local_24) {
    FArrayBox::FArrayBox
              (in_stack_fffffffffffffcd0,
               (FArrayBox *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
               (MakeType)((ulong)in_stack_fffffffffffffcc0 >> 0x20),(int)in_stack_fffffffffffffcc0,
               ncomp_00);
    setFab<amrex::FArrayBox,_0>
              (this_00,boxno,
               (FArrayBox *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    FArrayBox::~FArrayBox((FArrayBox *)0x5a2590);
  }
  pFVar3 = (FabArray<amrex::FArrayBox> *)Periodicity::NonPeriodic();
  ParallelCopy(in_stack_fffffffffffffd28,src,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
               (int)((ulong)factory >> 0x20),(int)factory,in_stack_fffffffffffffd40,
               in_stack_fffffffffffffd48,in_stack_fffffffffffffd50);
  ~FabArray(pFVar3);
  DistributionMapping::~DistributionMapping((DistributionMapping *)0x5a26a5);
  BoxArray::~BoxArray((BoxArray *)pFVar3);
  return;
}

Assistant:

void
FabArray<FAB>::copyTo (FAB& dest, int scomp, int dcomp, int ncomp, int nghost) const
{
    BL_PROFILE("FabArray::copy(fab)");

    BL_ASSERT(dcomp + ncomp <= dest.nComp());
    BL_ASSERT(IntVect(nghost).allLE(nGrowVect()));

    int root_proc = this->DistributionMap()[0];

    BoxArray ba(dest.box());
    DistributionMapping dm(Vector<int>{root_proc});
    FabArray<FAB> destmf(ba, dm, ncomp, 0, MFInfo().SetAlloc(false));
    if (ParallelDescriptor::MyProc() == root_proc) {
        destmf.setFab(0, FAB(dest, amrex::make_alias, dcomp, ncomp));
    }

    destmf.ParallelCopy(*this, scomp, 0, ncomp, nghost, 0);

#ifdef BL_USE_MPI
    using T = typename FAB::value_type;
    if (ParallelContext::NProcsSub() > 1) {
        Long count = dest.numPts()*ncomp;
        T* const p0 = dest.dataPtr(dcomp);
        T* pb = p0;
#ifdef AMREX_USE_GPU
        if (dest.arena()->isDevice()) {
            pb = (T*)The_Pinned_Arena()->alloc(sizeof(T)*count);
            Gpu::dtoh_memcpy_async(pb, p0, sizeof(T)*count);
            Gpu::streamSynchronize();
        }
#endif
        ParallelDescriptor::Bcast(pb, count, ParallelContext::global_to_local_rank(root_proc),
                                  ParallelContext::CommunicatorSub());
#ifdef AMREX_USE_GPU
        if (pb != p0) {
            Gpu::htod_memcpy_async(p0, pb, sizeof(T)*count);
            Gpu::streamSynchronize();
        }
#endif
    }
#endif
}